

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O0

uint nullcDebugConvertNativeAddressToInstruction(void *address)

{
  void *address_local;
  
  if ((NULLC::currExec == 1) && (NULLC::executorX86 != (ExecutorX86 *)0x0)) {
    address_local._4_4_ = ExecutorX86::GetInstructionAtAddress(NULLC::executorX86,address);
  }
  else {
    address_local._4_4_ = 0xffffffff;
  }
  return address_local._4_4_;
}

Assistant:

unsigned nullcDebugConvertNativeAddressToInstruction(void *address)
{
	using namespace NULLC;

#ifdef NULLC_BUILD_X86_JIT
	if(currExec == NULLC_X86 && executorX86)
		return executorX86->GetInstructionAtAddress(address);
#endif

	return ~0u;
}